

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateManager.cpp
# Opt level: O0

void __thiscall
helics::MessageFederateManager::removeOrderedMessage(MessageFederateManager *this,uint index)

{
  const_iterator __position;
  value_type vVar1;
  undefined1 uVar2;
  reference pvVar3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  value_type in_ESI;
  reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ri;
  reverse_iterator term;
  handle handle;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  *in_stack_ffffffffffffff58;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff60;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff68;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff70;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  guarded_opt<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::mutex>
  *in_stack_ffffffffffffff98;
  reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_38 [2];
  lock_handle<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::mutex> local_28;
  value_type local_c;
  
  local_c = in_ESI;
  gmlc::libguarded::
  guarded_opt<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::mutex>::lock
            (in_stack_ffffffffffffff98);
  vVar1 = local_c;
  gmlc::libguarded::
  lock_handle<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::mutex>::operator->
            (&local_28);
  pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::back(in_stack_ffffffffffffff60)
  ;
  if (vVar1 == *pvVar3) {
    gmlc::libguarded::
    lock_handle<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::mutex>::operator->
              (&local_28);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::pop_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x36d4d2);
  }
  else {
    gmlc::libguarded::
    lock_handle<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::mutex>::operator->
              (&local_28);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::rend(in_stack_ffffffffffffff68);
    gmlc::libguarded::
    lock_handle<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::mutex>::operator->
              (&local_28);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::rbegin(in_stack_ffffffffffffff68);
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::operator+((reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),
                (difference_type)in_stack_ffffffffffffff70);
    while (uVar2 = std::
                   operator==<__gnu_cxx::__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             ((reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               *)in_stack_ffffffffffffff70,
                              (reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               *)in_stack_ffffffffffffff68), ((uVar2 ^ 0xff) & 1) != 0) {
      in_stack_ffffffffffffff70 =
           (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
           std::
           reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        *)in_stack_ffffffffffffff60);
      if (*(value_type *)
           &(in_stack_ffffffffffffff70->
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start == local_c) {
        this_00 = gmlc::libguarded::
                  lock_handle<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::mutex>
                  ::operator->(&local_28);
        std::
        reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ::base(local_38);
        __gnu_cxx::
        __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
        ::__normal_iterator<unsigned_int*>
                  ((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                    *)this_00,in_stack_ffffffffffffff58);
        __position._M_current._7_1_ = uVar2;
        __position._M_current._0_7_ = in_stack_ffffffffffffff78;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::erase
                  (in_stack_ffffffffffffff70,__position);
        break;
      }
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    *)in_stack_ffffffffffffff60);
    }
  }
  gmlc::libguarded::
  lock_handle<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::mutex>::~lock_handle
            ((lock_handle<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::mutex> *)
             0x36d60a);
  return;
}

Assistant:

void MessageFederateManager::removeOrderedMessage(unsigned int index)
{
    auto handle = messageOrder.lock();
    if (index == handle->back()) {
        handle->pop_back();
    } else {
        auto term = handle->rend();
        for (auto ri = handle->rbegin() + 1; ri != term; ++ri) {
            if (*ri == index) {
                handle->erase(ri.base());
                break;
            }
        }
    }
}